

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::compute_order::
init<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array>
          (compute_order *this,
          solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
          *s,bit_array *x)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  
  if (this->order - infeasibility_decr < 2) {
    infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>const,baryonyx::bit_array>
              (this,s,x);
    return;
  }
  if (this->order == pi_sign_change) {
    piVar2 = (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    piVar1 = (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    if (piVar2 != piVar1) {
      iVar3 = 0;
      do {
        *piVar2 = iVar3;
        iVar3 = iVar3 + 1;
        piVar2 = piVar2 + 1;
      } while (piVar2 != piVar1);
    }
    return;
  }
  compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array>
            (s,x,&this->R);
  return;
}

Assistant:

void init(const Solver& s, const Xtype& x)
    {
        switch (order) {
        case solver_parameters::constraint_order::infeasibility_decr:
        case solver_parameters::constraint_order::infeasibility_incr:
            infeasibility_local_compute_violated_constraints(s, x);
            break;
        case solver_parameters::constraint_order::pi_sign_change:
            std::iota(R.begin(), R.end(), 0);
            break;
        case solver_parameters::constraint_order::none:
        case solver_parameters::constraint_order::reversing:
        case solver_parameters::constraint_order::random_sorting:
        case solver_parameters::constraint_order::lagrangian_decr:
        case solver_parameters::constraint_order::lagrangian_incr:
        default:
            compute_violated_constraints(s, x, R);
            break;
        }
    }